

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowPeerGlobalState::WindowPeerGlobalState
          (WindowPeerGlobalState *this,WindowPeerExecutor *executor,idx_t payload_count,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> _Var2;
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> local_28;
  idx_t local_20;
  
  local_20 = payload_count;
  WindowExecutorGlobalState::WindowExecutorGlobalState
            (&this->super_WindowExecutorGlobalState,&executor->super_WindowExecutor,payload_count,
             partition_mask,order_mask);
  (this->super_WindowExecutorGlobalState).super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowPeerGlobalState_017aa780;
  (this->token_tree).
  super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>.
  super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = (WindowTokenTree *)0x0;
  if ((executor->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (executor->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    make_uniq<duckdb::WindowTokenTree,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>const&,duckdb::vector<unsigned_long,true>const&,unsigned_long_const&>
              ((duckdb *)&local_28,(executor->super_WindowExecutor).context,
               &((executor->super_WindowExecutor).wexpr)->arg_orders,&executor->arg_order_idx,
               &local_20);
    _Var2._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (WindowTokenTree *)0x0;
    _Var1._M_head_impl =
         (this->token_tree).
         super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
         .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl;
    (this->token_tree).
    super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
    .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (WindowTokenTree *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WindowMergeSortTree + 8))();
      if (local_28._M_head_impl != (WindowTokenTree *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
  }
  return;
}

Assistant:

WindowPeerGlobalState(const WindowPeerExecutor &executor, const idx_t payload_count,
	                      const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowExecutorGlobalState(executor, payload_count, partition_mask, order_mask) {
		if (!executor.arg_order_idx.empty()) {
			token_tree = make_uniq<WindowTokenTree>(executor.context, executor.wexpr.arg_orders, executor.arg_order_idx,
			                                        payload_count);
		}
	}